

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O3

TWords * __thiscall
NJamSpell::TSpellCorrector::GetCandidatesRaw
          (TWords *__return_storage_ptr__,TSpellCorrector *this,TWords *sentence,size_t position)

{
  size_type *psVar1;
  pointer *ppTVar2;
  double dVar3;
  pointer pTVar4;
  pointer pTVar5;
  wchar_t *pwVar6;
  size_t sVar7;
  size_t sVar8;
  TWord origWord;
  pointer pTVar9;
  vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *this_00;
  TSpellCorrector *pTVar10;
  pointer pTVar11;
  pointer pTVar12;
  pointer pTVar13;
  pointer pTVar14;
  pointer pTVar15;
  TWord *pTVar16;
  ulong uVar17;
  long lVar18;
  iterator iVar19;
  long *plVar20;
  long lVar21;
  undefined1 auVar22 [8];
  __normal_iterator<NJamSpell::TScoredWord_*,_std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>_>
  __i;
  pointer pTVar23;
  bool bVar24;
  bool bVar25;
  wchar_t wVar26;
  wchar_t wVar27;
  wchar_t wVar28;
  wchar_t wVar29;
  undefined1 auStack_108 [8];
  TWord cand;
  unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
  uniqueCandidates;
  TScoredWord local_b8;
  vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *local_98;
  TSpellCorrector *local_90;
  undefined1 auStack_88 [8];
  TWord w;
  TScoredWord s;
  undefined1 auStack_58 [8];
  vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> scoredCandidates;
  
  pTVar4 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)pTVar4 >> 4) <= position) {
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  pTVar4 = pTVar4 + position;
  pwVar6 = pTVar4->Ptr;
  sVar7 = pTVar4->Len;
  pTVar16 = (TWord *)auStack_88;
  auStack_88._0_4_ = SUB84(pwVar6,0);
  auStack_88._4_4_ = (undefined4)((ulong)pwVar6 >> 0x20);
  w.Ptr._0_4_ = (undefined4)sVar7;
  w.Ptr._4_4_ = (undefined4)(sVar7 >> 0x20);
  Edits2(__return_storage_ptr__,this,pTVar16,true);
  pTVar4 = (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar12 = pTVar5;
  pTVar14 = pTVar4;
  if (pTVar4 == pTVar5) {
    Edits((TWords *)&cand.Len,this,(TWord *)auStack_88);
    pTVar14 = (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)cand.Len;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)uniqueCandidates._M_h._M_buckets;
    (__return_storage_ptr__->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)uniqueCandidates._M_h._M_bucket_count;
    cand.Len = 0;
    uniqueCandidates._M_h._M_buckets = (__buckets_ptr)0x0;
    uniqueCandidates._M_h._M_bucket_count = 0;
    if ((pTVar14 != (pointer)0x0) && (operator_delete(pTVar14), cand.Len != 0)) {
      operator_delete((void *)cand.Len);
    }
    pTVar14 = (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pTVar12 = (__return_storage_ptr__->
              super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (pTVar14 == pTVar12) {
    return __return_storage_ptr__;
  }
  psVar1 = &uniqueCandidates._M_h._M_bucket_count;
  cand.Len = (size_t)psVar1;
  local_98 = (vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)__return_storage_ptr__;
  local_90 = this;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&cand.Len,CONCAT44(auStack_88._4_4_,auStack_88._0_4_),
             CONCAT44(auStack_88._4_4_,auStack_88._0_4_) + CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_) * 4);
  _auStack_58 = TLangModel::GetWord(&local_90->LangModel,(wstring *)&cand.Len);
  if ((size_type *)cand.Len != psVar1) {
    operator_delete((void *)cand.Len);
  }
  pTVar10 = local_90;
  bVar24 = auStack_58 == (wchar_t *)0x0;
  bVar25 = auStack_58._8_8_ == 0;
  if (bVar25 || bVar24) {
    iVar19._M_current =
         (__return_storage_ptr__->
         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00113ddb;
  }
  else {
    auStack_88._0_4_ = auStack_58._0_4_;
    auStack_88._4_4_ = auStack_58._4_4_;
    w.Ptr._0_4_ = auStack_58._8_4_;
    w.Ptr._4_4_ = auStack_58._12_4_;
    iVar19._M_current =
         (__return_storage_ptr__->
         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar19._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      pTVar16 = (TWord *)auStack_58;
LAB_00113ddb:
      std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
      _M_realloc_insert<NJamSpell::TWord_const&>
                ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)__return_storage_ptr__
                 ,iVar19,pTVar16);
      goto LAB_00113de6;
    }
  }
  *(undefined4 *)&(iVar19._M_current)->Ptr = auStack_88._0_4_;
  *(undefined4 *)((long)&(iVar19._M_current)->Ptr + 4) = auStack_88._4_4_;
  *(undefined4 *)&(iVar19._M_current)->Len = w.Ptr._0_4_;
  *(undefined4 *)((long)&(iVar19._M_current)->Len + 4) = w.Ptr._4_4_;
  ppTVar2 = &(__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppTVar2 = *ppTVar2 + 1;
LAB_00113de6:
  std::
  _Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<NJamSpell::TWord*,std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>>>
            ((_Hashtable<NJamSpell::TWord,NJamSpell::TWord,std::allocator<NJamSpell::TWord>,std::__detail::_Identity,std::equal_to<NJamSpell::TWord>,NJamSpell::TWordHashPtr,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&cand.Len,
             (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,auStack_58,&w.Len,&local_b8);
  origWord.Ptr._4_4_ = auStack_88._4_4_;
  origWord.Ptr._0_4_ = auStack_88._0_4_;
  origWord.Len._0_4_ = w.Ptr._0_4_;
  origWord.Len._4_4_ = w.Ptr._4_4_;
  FilterCandidatesByFrequency
            (pTVar10,(unordered_set<NJamSpell::TWord,_NJamSpell::TWordHashPtr,_std::equal_to<NJamSpell::TWord>,_std::allocator<NJamSpell::TWord>_>
                      *)&cand.Len,origWord);
  _auStack_58 = (TWord)ZEXT816(0);
  scoredCandidates.
  super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>::reserve
            ((vector<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_> *)auStack_58,
             (size_type)uniqueCandidates._M_h._M_before_begin._M_nxt);
  if (uniqueCandidates._M_h._M_bucket_count != 0) {
    plVar20 = (long *)uniqueCandidates._M_h._M_bucket_count;
    do {
      auStack_108 = (undefined1  [8])plVar20[1];
      cand.Ptr = (wchar_t *)plVar20[2];
      w.Len = 0;
      s.Word.Ptr = (wchar_t *)0x0;
      pTVar14 = (sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((sentence->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
          _M_impl.super__Vector_impl_data._M_finish != pTVar14) {
        lVar21 = 0;
        uVar17 = 0;
        do {
          if (position == uVar17) {
            if (s.Word.Ptr == (wchar_t *)0x0) {
              pTVar16 = (TWord *)auStack_108;
LAB_00113ef5:
              std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
              _M_realloc_insert<NJamSpell::TWord_const&>
                        ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)&w.Len,
                         (iterator)s.Word.Ptr,pTVar16);
            }
            else {
              wVar26 = auStack_108._0_4_;
              wVar27 = auStack_108._4_4_;
              wVar28 = (wchar_t)cand.Ptr;
              wVar29 = cand.Ptr._4_4_;
LAB_00113ee3:
              *s.Word.Ptr = wVar26;
              s.Word.Ptr[1] = wVar27;
              s.Word.Ptr[2] = wVar28;
              s.Word.Ptr[3] = wVar29;
              s.Word.Ptr = s.Word.Ptr + 4;
            }
          }
          else if ((uVar17 < position && position <= uVar17 + 2) ||
                  (uVar17 <= position + 2 && position < uVar17)) {
            pTVar16 = (TWord *)((long)&pTVar14->Ptr + lVar21);
            if (s.Word.Ptr == (wchar_t *)0x0) goto LAB_00113ef5;
            wVar26 = *(wchar_t *)&pTVar16->Ptr;
            wVar27 = *(wchar_t *)((long)&pTVar16->Ptr + 4);
            wVar28 = (wchar_t)pTVar16->Len;
            wVar29 = *(wchar_t *)((long)&pTVar16->Len + 4);
            goto LAB_00113ee3;
          }
          uVar17 = uVar17 + 1;
          pTVar14 = (sentence->
                    super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          lVar21 = lVar21 + 0x10;
        } while (uVar17 < (ulong)((long)(sentence->
                                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar14
                                 >> 4));
      }
      pTVar10 = local_90;
      local_b8.Score = 0.0;
      local_b8.Word.Ptr = (wchar_t *)auStack_108;
      local_b8.Word.Len = (size_t)cand.Ptr;
      local_b8.Score = TLangModel::Score(&local_90->LangModel,(TWords *)&w.Len);
      if ((local_b8.Word.Ptr != (wchar_t *)CONCAT44(auStack_88._4_4_,auStack_88._0_4_)) ||
         ((wchar_t *)local_b8.Word.Len != (wchar_t *)CONCAT44(w.Ptr._4_4_,w.Ptr._0_4_))) {
        if (bVar25 || bVar24) {
          local_b8.Score = local_b8.Score - pTVar10->UnknownWordsPenalty;
        }
        else if (pTVar4 == pTVar5) {
          local_b8.Score = local_b8.Score * 50.0;
        }
        else {
          local_b8.Score = local_b8.Score - pTVar10->KnownWordsPenalty;
        }
      }
      if (scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>::
        _M_realloc_insert<NJamSpell::TScoredWord_const&>
                  ((vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>> *)
                   auStack_58,
                   (iterator)
                   scoredCandidates.
                   super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                   ._M_impl.super__Vector_impl_data._M_start,&local_b8);
      }
      else {
        (scoredCandidates.
         super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl
         .super__Vector_impl_data._M_start)->Score = local_b8.Score;
        ((scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start)->Word).Ptr = local_b8.Word.Ptr;
        ((scoredCandidates.
          super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
          _M_impl.super__Vector_impl_data._M_start)->Word).Len = local_b8.Word.Len;
        scoredCandidates.
        super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
        super__Vector_impl_data._M_start =
             scoredCandidates.
             super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
             _M_impl.super__Vector_impl_data._M_start + 1;
      }
      if (w.Len != 0) {
        operator_delete((void *)w.Len);
      }
      plVar20 = (long *)*plVar20;
    } while (plVar20 != (long *)0x0);
  }
  auVar22 = auStack_58;
  pTVar11 = scoredCandidates.
            super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (auStack_58 !=
      (undefined1  [8])
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar18 = (long)scoredCandidates.
                   super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58;
    uVar17 = (lVar18 >> 3) * -0x5555555555555555;
    lVar21 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
              (auStack_58,
               scoredCandidates.
               super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
               _M_impl.super__Vector_impl_data._M_start,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar18 < 0x181) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (auVar22,pTVar11);
    }
    else {
      pTVar23 = (pointer)((long)auVar22 + 0x180);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<NJamSpell::TScoredWord*,std::vector<NJamSpell::TScoredWord,std::allocator<NJamSpell::TScoredWord>>>,__gnu_cxx::__ops::_Iter_comp_iter<NJamSpell::TSpellCorrector::GetCandidatesRaw(std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>const&,unsigned_long)const::__0>>
                (auVar22,pTVar23);
      for (; pTVar23 != pTVar11; pTVar23 = pTVar23 + 1) {
        w.Len = (size_t)(pTVar23->Word).Ptr;
        sVar7 = (pTVar23->Word).Len;
        dVar3 = pTVar23->Score;
        pTVar13 = pTVar23;
        pTVar15 = pTVar23;
        if (pTVar23[-1].Score <= dVar3 && dVar3 != pTVar23[-1].Score) {
          do {
            pTVar13 = pTVar15 + -1;
            pTVar15->Score = pTVar15[-1].Score;
            sVar8 = pTVar15[-1].Word.Len;
            (pTVar15->Word).Ptr = pTVar15[-1].Word.Ptr;
            (pTVar15->Word).Len = sVar8;
            pTVar9 = pTVar15 + -2;
            pTVar15 = pTVar13;
          } while (pTVar9->Score <= dVar3 && dVar3 != pTVar9->Score);
        }
        (pTVar13->Word).Ptr = (wchar_t *)w.Len;
        (pTVar13->Word).Len = sVar7;
        pTVar13->Score = dVar3;
      }
    }
  }
  this_00 = local_98;
  if (*(long *)(local_98 + 8) != *(long *)local_98) {
    *(long *)(local_98 + 8) = *(long *)local_98;
  }
  pTVar11 = scoredCandidates.
            super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (auStack_58 !=
      (undefined1  [8])
      scoredCandidates.
      super__Vector_base<NJamSpell::TScoredWord,_std::allocator<NJamSpell::TScoredWord>_>._M_impl.
      super__Vector_impl_data._M_start) {
    auVar22 = auStack_58;
    do {
      w.Len = (size_t)(((pointer)auVar22)->Word).Ptr;
      iVar19._M_current = *(TWord **)(this_00 + 8);
      if (iVar19._M_current == *(TWord **)(this_00 + 0x10)) {
        std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
        _M_realloc_insert<NJamSpell::TWord_const&>(this_00,iVar19,(TWord *)&w.Len);
      }
      else {
        sVar7 = (((pointer)auVar22)->Word).Len;
        (iVar19._M_current)->Ptr = (((pointer)auVar22)->Word).Ptr;
        (iVar19._M_current)->Len = sVar7;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x10;
      }
      auVar22 = (undefined1  [8])((long)auVar22 + 0x18);
    } while (auVar22 != (undefined1  [8])pTVar11);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58);
  }
  std::
  _Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<NJamSpell::TWord,_NJamSpell::TWord,_std::allocator<NJamSpell::TWord>,_std::__detail::_Identity,_std::equal_to<NJamSpell::TWord>,_NJamSpell::TWordHashPtr,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&cand.Len);
  return (TWords *)this_00;
}

Assistant:

TWords TSpellCorrector::GetCandidatesRaw(const TWords& sentence, size_t position) const {
    if (position >= sentence.size()) {
        return TWords();
    }

    TWord w = sentence[position];

    TWords candidates = Edits2(w);

    bool firstLevel = true;
    bool knownWord = false;
    if (candidates.empty()) {
        candidates = Edits(w);
        firstLevel = false;
    }

    if (candidates.empty()) {
        return candidates;
    }

    {
        TWord c = LangModel.GetWord(std::wstring(w.Ptr, w.Len));
        if (c.Ptr && c.Len) {
            w = c;
            candidates.push_back(c);
            knownWord = true;
        } else {
            candidates.push_back(w);
        }
    }

    std::unordered_set<TWord, TWordHashPtr> uniqueCandidates(candidates.begin(), candidates.end());

    FilterCandidatesByFrequency(uniqueCandidates, w);

    std::vector<TScoredWord> scoredCandidates;
    scoredCandidates.reserve(uniqueCandidates.size());

    for (TWord cand: uniqueCandidates) {
        TWords candSentence;
        for (size_t i = 0; i < sentence.size(); ++i) {
            if (i == position) {
                candSentence.push_back(cand);
            } else if ((i < position && i + 2 >= position) ||
                       (i > position && i <= position + 2))
            {
                candSentence.push_back(sentence[i]);
            }
        }

        TScoredWord scored;
        scored.Word = cand;
        scored.Score = LangModel.Score(candSentence);
        if (!(scored.Word == w)) {
            if (knownWord) {
                if (firstLevel) {
                    scored.Score -= KnownWordsPenalty;
                } else {
                    scored.Score *= 50.0;
                }
            } else {
                scored.Score -= UnknownWordsPenalty;
            }
        }
        scoredCandidates.push_back(scored);
    }

    std::sort(scoredCandidates.begin(), scoredCandidates.end(), [](TScoredWord w1, TScoredWord w2) {
        return w1.Score > w2.Score;
    });

    candidates.clear();
    for (auto s: scoredCandidates) {
        candidates.push_back(s.Word);
    }
    return candidates;
}